

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_processing_impl.cc
# Opt level: O3

int __thiscall
webrtc::AudioProcessingImpl::StartDebugRecording
          (AudioProcessingImpl *this,FILE *handle,int64_t max_log_size_bytes)

{
  CritScope cs_render;
  CritScope cs_capture;
  CritScope local_20;
  CritScope local_18;
  
  rtc::CritScope::CritScope(&local_20,&this->crit_render_);
  rtc::CritScope::CritScope(&local_18,&this->crit_capture_);
  rtc::CritScope::~CritScope(&local_18);
  rtc::CritScope::~CritScope(&local_20);
  return -4 - (uint)(handle == (FILE *)0x0);
}

Assistant:

int AudioProcessingImpl::StartDebugRecording(FILE* handle,
                                             int64_t max_log_size_bytes) {
  // Run in a single-threaded manner.
  rtc::CritScope cs_render(&crit_render_);
  rtc::CritScope cs_capture(&crit_capture_);

  if (handle == nullptr) {
    return kNullPointerError;
  }

#ifdef WEBRTC_AUDIOPROC_DEBUG_DUMP
  debug_dump_.num_bytes_left_for_log_ = max_log_size_bytes;

  // Stop any ongoing recording.
  if (debug_dump_.debug_file->Open()) {
    if (debug_dump_.debug_file->CloseFile() == -1) {
      return kFileError;
    }
  }

  if (debug_dump_.debug_file->OpenFromFileHandle(handle, true, false) == -1) {
    return kFileError;
  }

  RETURN_ON_ERR(WriteConfigMessage(true));
  RETURN_ON_ERR(WriteInitMessage());
  return kNoError;
#else
  return kUnsupportedFunctionError;
#endif  // WEBRTC_AUDIOPROC_DEBUG_DUMP
}